

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O1

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeArrayFill<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Index pos)

{
  undefined8 *puVar1;
  undefined1 local_88 [8];
  Result<wasm::HeapType> type;
  Result<wasm::HeapType> _val;
  undefined8 local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  typeidx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((Result<wasm::HeapType> *)local_88,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                  ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                          super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                          super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                          super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                          super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
                  (_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_88);
  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
    _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = &local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),
               type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_,
               (long)_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                     _M_first._M_storage.id +
               type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10)
    ;
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ == &local_28) {
      *puVar1 = CONCAT71(uStack_27,local_28);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
           uStack_20;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
           _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> +
                0x10) = CONCAT71(uStack_27,local_28);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) = local_30
    ;
    local_28 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
         '\x01';
    _val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = &local_28;
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                      ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)
                      ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                              super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\0';
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeArrayFill(Ctx& ctx, Index pos) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  return ctx.makeArrayFill(pos, *type);
}